

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O2

void __thiscall
ot::commissioner::JoinerSession::SendJoinFinResponse
          (JoinerSession *this,Request *aJoinFinReq,bool aAccept)

{
  char cVar1;
  ErrorCode EVar2;
  Error *pEVar3;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  allocator local_179;
  undefined1 local_178 [8];
  char *pcStack_170;
  undefined1 local_168 [24];
  code *local_150;
  code *local_148;
  writer write;
  undefined1 local_120 [32];
  string local_100;
  Error error;
  Response joinFin;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  coap::Message::Message(&joinFin,kAcknowledgment,kChanged);
  tlv::Tlv::Tlv((Tlv *)local_120,kNetworkDiagChildTable,aAccept - 1U | 1,kMeshCoP);
  AppendTlv((Error *)local_178,&joinFin,(Tlv *)local_120);
  pEVar3 = Error::operator=(&error,(Error *)local_178);
  EVar2 = pEVar3->mCode;
  std::__cxx11::string::~string((string *)&pcStack_170);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_120 + 8));
  if (EVar2 == kNone) {
    joinFin.mSubType = kJoinFinResponse;
    coap::Coap::SendResponse((Error *)local_178,&this->mCoap,aJoinFinReq,&joinFin);
    pEVar3 = Error::operator=(&error,(Error *)local_178);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)&pcStack_170);
    if (EVar2 == kNone) {
      std::__cxx11::string::string((string *)local_120,"joiner-session",&local_179);
      local_178._0_4_ = pointer_type;
      local_178._4_4_ = bool_type;
      pcStack_170 = "session(={}) sent JOIN_FIN.rsp: accepted={}";
      local_168._0_8_ = 0x2b;
      local_168._8_8_ = 0x200000000;
      local_150 = ::fmt::v10::detail::
                  parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
      local_148 = ::fmt::v10::detail::
                  parse_format_specs<bool,fmt::v10::detail::compile_parse_context<char>>;
      pcVar4 = "session(={}) sent JOIN_FIN.rsp: accepted={}";
      local_168._16_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
            *)local_178;
      write.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
            *)local_178;
      while (pcVar4 != "") {
        cVar1 = *pcVar4;
        pcVar5 = pcVar4;
        while (cVar1 != '{') {
          pcVar5 = pcVar5 + 1;
          if (pcVar5 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_bool>_>
            ::writer::operator()(&write,pcVar4,"");
            goto LAB_001b69a8;
          }
          cVar1 = *pcVar5;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_bool>_>
        ::writer::operator()(&write,pcVar4,pcVar5);
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,bool>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                             *)local_178);
      }
LAB_001b69a8:
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_178;
      fmt.size_ = 0x7e;
      fmt.data_ = (char *)0x2b;
      local_178 = (undefined1  [8])this;
      local_168._0_8_ = (ulong)aAccept;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_100,(v10 *)"session(={}) sent JOIN_FIN.rsp: accepted={}",fmt,args);
      Log(kInfo,(string *)local_120,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)local_120);
    }
  }
  if (error.mCode != kNone) {
    std::__cxx11::string::string((string *)local_120,"joiner-session",&local_179);
    local_178._0_4_ = string_type;
    pcStack_170 = "session(={}) sent JOIN_FIN.rsp failed: %s";
    local_168._0_8_ = 0x29;
    local_168._8_8_ = 0x100000000;
    local_150 = ::fmt::v10::detail::
                parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar4 = "session(={}) sent JOIN_FIN.rsp failed: %s";
    local_168._16_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
          *)local_178;
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
          *)local_178;
    while (pcVar4 != "") {
      cVar1 = *pcVar4;
      pcVar5 = pcVar4;
      while (cVar1 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)&write,pcVar4,"");
          goto LAB_001b6ac1;
        }
        cVar1 = *pcVar5;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()((writer *)&write,pcVar4,pcVar5);
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar5,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_178);
    }
LAB_001b6ac1:
    Error::ToString_abi_cxx11_((string *)local_178,&error);
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
          *)local_178;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&write;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x29;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_100,(v10 *)"session(={}) sent JOIN_FIN.rsp failed: %s",fmt_00,args_00);
    Log(kWarn,(string *)local_120,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string((string *)local_120);
  }
  coap::Message::~Message(&joinFin);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void JoinerSession::SendJoinFinResponse(const coap::Request &aJoinFinReq, bool aAccept)
{
    Error          error;
    coap::Response joinFin{coap::Type::kAcknowledgment, coap::Code::kChanged};
    SuccessOrExit(error = AppendTlv(joinFin, {tlv::Type::kState, aAccept ? tlv::kStateAccept : tlv::kStateReject}));

    joinFin.SetSubType(MessageSubType::kJoinFinResponse);
    SuccessOrExit(error = mCoap.SendResponse(aJoinFinReq, joinFin));

    LOG_INFO(LOG_REGION_JOINER_SESSION, "session(={}) sent JOIN_FIN.rsp: accepted={}", static_cast<void *>(this),
             aAccept);

#if OT_COMM_CONFIG_REFERENCE_DEVICE_ENABLE
    LOG_INFO(LOG_REGION_THCI, "session(={}) sent JOIN_FIN.rsp: {}", static_cast<void *>(this),
             utils::Hex(joinFin.GetPayload()));
#endif

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_WARN(LOG_REGION_JOINER_SESSION, "session(={}) sent JOIN_FIN.rsp failed: %s", error.ToString());
    }
}